

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O2

Aig_Man_t *
Saig_ManDupUnfoldConstrsFunc
          (Aig_Man_t *pAig,int nFrames,int nConfs,int nProps,int fOldAlgo,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Vec_t *p;
  Aig_Man_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  void *pvVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  Vec_Vec_t *local_40;
  Vec_Ptr_t *local_38;
  
  if (fOldAlgo == 0) {
    p = Ssw_ManFindDirectImplications(pAig,nFrames,nConfs,nProps,fVerbose);
  }
  else {
    p = Saig_ManDetectConstrFunc(pAig,nFrames,nConfs,nProps,fVerbose);
  }
  local_40 = p;
  if (p != (Vec_Vec_t *)0x0) {
    iVar1 = Vec_VecSizeSize(p);
    if (iVar1 != 0) {
      pAVar4 = Aig_ManDupWithoutPos(pAig);
      iVar1 = pAig->nConstrs;
      iVar2 = Vec_VecSizeSize(p);
      pAVar4->nConstrs = iVar2 + iVar1;
      for (iVar1 = 0; iVar1 < pAig->nTruePos; iVar1 = iVar1 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar1);
        pAVar5 = Aig_ObjChild0Copy(pAVar5);
        Aig_ObjCreateCo(pAVar4,pAVar5);
      }
      p_00 = Vec_PtrAlloc(100);
      for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
        p_01 = Vec_VecEntry(p,iVar1);
        for (iVar2 = 0; iVar2 < p_01->nSize; iVar2 = iVar2 + 1) {
          pvVar6 = Vec_PtrEntry(p_01,iVar2);
          Vec_PtrPush(p_00,(void *)((ulong)((uint)pvVar6 & 1) ^
                                   *(ulong *)(((ulong)pvVar6 & 0xfffffffffffffffe) + 0x28)));
          iVar7 = iVar1;
          while( true ) {
            bVar9 = iVar7 == 0;
            iVar7 = iVar7 + -1;
            if (bVar9) break;
            pAVar5 = Aig_ObjCreateCi(pAVar4);
            Vec_PtrPush(p_00,pAVar5);
          }
          if (p_00->nSize < 1) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x2e6,"void *Vec_PtrPop(Vec_Ptr_t *)");
          }
          uVar3 = p_00->nSize - 1;
          p_00->nSize = uVar3;
          Aig_ObjCreateCo(pAVar4,(Aig_Obj_t *)p_00->pArray[uVar3]);
        }
      }
      for (iVar1 = 0; iVar1 < pAig->nRegs; iVar1 = iVar1 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar1);
        pAVar5 = Aig_ObjChild0Copy(pAVar5);
        Aig_ObjCreateCo(pAVar4,pAVar5);
      }
      iVar1 = 0;
      for (iVar2 = 0; iVar2 < p->nSize; iVar2 = iVar2 + 1) {
        local_38 = Vec_VecEntry(p,iVar2);
        for (iVar7 = 0; iVar7 < local_38->nSize; iVar7 = iVar7 + 1) {
          Vec_PtrEntry(local_38,iVar7);
          for (iVar8 = 0; iVar2 != iVar8; iVar8 = iVar8 + 1) {
            pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar8 + iVar1);
            Aig_ObjCreateCo(pAVar4,pAVar5);
          }
          iVar1 = iVar1 + iVar2;
        }
      }
      if (iVar1 == p_00->nSize) {
        Aig_ManSetRegNum(pAVar4,iVar1 + pAig->nRegs);
        Vec_VecFreeP(&local_40);
        Vec_PtrFree(p_00);
        return pAVar4;
      }
      __assert_fail("nNewFlops == Vec_PtrSize(vNewFlops)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr2.c"
                    ,0x39c,
                    "Aig_Man_t *Saig_ManDupUnfoldConstrsFunc(Aig_Man_t *, int, int, int, int, int)")
      ;
    }
  }
  Vec_VecFreeP(&local_40);
  pAVar4 = Aig_ManDupDfs(pAig);
  return pAVar4;
}

Assistant:

Aig_Man_t * Saig_ManDupUnfoldConstrsFunc( Aig_Man_t * pAig, int nFrames, int nConfs, int nProps, int fOldAlgo, int fVerbose )
{
    Aig_Man_t * pNew;
    Vec_Vec_t * vCands;
    Vec_Ptr_t * vNodes, * vNewFlops;
    Aig_Obj_t * pObj;
    int i, j, k, nNewFlops;
    if ( fOldAlgo )
        vCands = Saig_ManDetectConstrFunc( pAig, nFrames, nConfs, nProps, fVerbose );
    else
        vCands = Ssw_ManFindDirectImplications( pAig, nFrames, nConfs, nProps, fVerbose );
    if ( vCands == NULL || Vec_VecSizeSize(vCands) == 0 )
    {
        Vec_VecFreeP( &vCands );
        return Aig_ManDupDfs( pAig );
    }
    // create new manager
    pNew = Aig_ManDupWithoutPos( pAig );
    pNew->nConstrs = pAig->nConstrs + Vec_VecSizeSize(vCands);
    // add normal POs
    Saig_ManForEachPo( pAig, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // create constraint outputs
    vNewFlops = Vec_PtrAlloc( 100 );
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            Vec_PtrPush( vNewFlops, Aig_ObjRealCopy(pObj) );
            for ( j = 0; j < i; j++ )
                Vec_PtrPush( vNewFlops, Aig_ObjCreateCi(pNew) );
            Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrPop(vNewFlops) );
        }
    }
    // add latch outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // add new latch outputs
    nNewFlops = 0;
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            for ( j = 0; j < i; j++ )
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vNewFlops, nNewFlops++) );
        }
    }
    assert( nNewFlops == Vec_PtrSize(vNewFlops) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(pAig) + nNewFlops );
    Vec_VecFreeP( &vCands );
    Vec_PtrFree( vNewFlops );
    return pNew;
}